

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plf_stack.h
# Opt level: O0

void __thiscall
plf::stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_>::push
          (stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_> *this,
          MatchingStateDebugFailures *element)

{
  element_pointer_type pMVar1;
  char cVar2;
  pointer_conflict pgVar3;
  ebco_pair *local_48;
  MatchingStateDebugFailures *element_local;
  stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_> *this_local;
  
  cVar2 = (this->top_element == (element_pointer_type)0x0) +
          (this->top_element == this->end_element);
  if (cVar2 == '\0') {
    pMVar1 = this->top_element;
    this->top_element = pMVar1 + 1;
    std::allocator_traits<std::allocator<MatchingStateDebugFailures>>::
    construct<MatchingStateDebugFailures,MatchingStateDebugFailures>
              ((allocator_type *)this,pMVar1 + 1,element);
    this->total_number_of_elements = this->total_number_of_elements + 1;
  }
  else if (cVar2 == '\x01') {
    if (this->current_group->next_group == (group_pointer_type)0x0) {
      pgVar3 = std::
               allocator_traits<std::allocator<plf::stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_>::group>_>
               ::allocate((allocator_type *)&this->group_allocator_pair,1,this->current_group);
      this->current_group->next_group = pgVar3;
      if (this->total_number_of_elements < (this->group_allocator_pair).max_block_capacity) {
        local_48 = (ebco_pair *)&this->total_number_of_elements;
      }
      else {
        local_48 = &this->group_allocator_pair;
      }
      std::
      allocator_traits<std::allocator<plf::stack<MatchingStateDebugFailures,std::allocator<MatchingStateDebugFailures>>::group>>
      ::
      construct<plf::stack<MatchingStateDebugFailures,std::allocator<MatchingStateDebugFailures>>::group,unsigned_long&,plf::stack<MatchingStateDebugFailures,std::allocator<MatchingStateDebugFailures>>::group*&>
                ((allocator_type *)&this->group_allocator_pair,this->current_group->next_group,
                 &local_48->max_block_capacity,&this->current_group);
    }
    this->current_group = this->current_group->next_group;
    pMVar1 = this->current_group->elements;
    this->top_element = pMVar1;
    this->start_element = pMVar1;
    std::allocator_traits<std::allocator<MatchingStateDebugFailures>>::
    construct<MatchingStateDebugFailures,MatchingStateDebugFailures>
              ((allocator_type *)this,this->top_element,element);
    this->end_element = this->current_group->end;
    this->total_number_of_elements = this->total_number_of_elements + 1;
  }
  else if (cVar2 == '\x02') {
    initialize(this);
    std::allocator_traits<std::allocator<MatchingStateDebugFailures>>::
    construct<MatchingStateDebugFailures,MatchingStateDebugFailures>
              ((allocator_type *)this,this->top_element,element);
    this->total_number_of_elements = this->total_number_of_elements + 1;
  }
  return;
}

Assistant:

void push(element_type &&element)
		{
			switch ((top_element == NULL) + (top_element == end_element))
			{
				case 0:
				{
					#ifdef PLF_TYPE_TRAITS_SUPPORT
						if PLF_CONSTEXPR (std::is_nothrow_move_constructible<element_type>::value)
						{
							PLF_CONSTRUCT(element_allocator_type, *this, ++top_element, std::move(element));
						}
						else
					#endif
					{
						try
						{
							PLF_CONSTRUCT(element_allocator_type, *this, ++top_element, std::move(element));
						}
						catch (...)
						{
							--top_element;
							throw;
						}
					}

					++total_number_of_elements;
					return;
				}
				case 1:
				{
					if (current_group->next_group == NULL)
					{
						current_group->next_group = PLF_ALLOCATE(group_allocator_type, group_allocator_pair, 1, current_group);

						try
						{
							#ifdef PLF_VARIADICS_SUPPORT
								PLF_CONSTRUCT(group_allocator_type, group_allocator_pair, current_group->next_group, (total_number_of_elements < group_allocator_pair.max_block_capacity) ? total_number_of_elements : group_allocator_pair.max_block_capacity, current_group);
							#else
								PLF_CONSTRUCT(group_allocator_type, group_allocator_pair, current_group->next_group, group((total_number_of_elements < group_allocator_pair.max_block_capacity) ? total_number_of_elements : group_allocator_pair.max_block_capacity, current_group));
							#endif
						}
						catch (...)
						{
							PLF_DEALLOCATE(group_allocator_type, group_allocator_pair, current_group->next_group, 1);
							current_group->next_group = NULL;
							throw;
						}
					}

					current_group = current_group->next_group;
					start_element = top_element = current_group->elements;

					#ifdef PLF_TYPE_TRAITS_SUPPORT
						if PLF_CONSTEXPR (std::is_nothrow_move_constructible<element_type>::value)
						{
							PLF_CONSTRUCT(element_allocator_type, *this, top_element, std::move(element));
						}
						else
					#endif
					{
						try
						{
							PLF_CONSTRUCT(element_allocator_type, *this, top_element, std::move(element));
						}
						catch (...)
						{
							current_group = current_group->previous_group;
							start_element = current_group->elements;
							top_element = current_group->end;
							throw;
						}
					}


					end_element = current_group->end;
					++total_number_of_elements;
					return;
				}
				case 2: // ie. empty stack, must initialize
				{
					initialize();

					#ifdef PLF_TYPE_TRAITS_SUPPORT
						if PLF_CONSTEXPR (std::is_nothrow_move_constructible<element_type>::value)
						{
							PLF_CONSTRUCT(element_allocator_type, *this, top_element, std::move(element));
						}
						else
					#endif
					{
						try
						{
							PLF_CONSTRUCT(element_allocator_type, *this, top_element, std::move(element));
						}
						catch (...)
						{
							clear();
							throw;
						}
					}


					++total_number_of_elements;
					return;
				}
			}
		}